

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.cpp
# Opt level: O0

int main(void)

{
  Result RVar1;
  ssize_t sVar2;
  size_t __n;
  void *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *extraout_RDX_00;
  Gpio local_20;
  Gpio gpio_2;
  Gpio gpio_1;
  Result status;
  
  signal(2,sig_handler);
  mraa::Gpio::Gpio(&gpio_2,0x17,true,false);
  __n = 0;
  mraa::Gpio::Gpio(&local_20,0x18,true,false);
  RVar1 = mraa::Gpio::dir(&gpio_2,DIR_OUT);
  if (RVar1 == SUCCESS) {
    RVar1 = mraa::Gpio::dir(&local_20,DIR_OUT);
    __buf = extraout_RDX;
    if (RVar1 == SUCCESS) {
      while (flag != 0) {
        sVar2 = mraa::Gpio::write(&gpio_2,1,__buf,__n);
        if ((Result)sVar2 != SUCCESS) {
          mraa::printError((Result)sVar2);
          gpio_1.m_gpio._4_4_ = 1;
          goto LAB_0010250e;
        }
        sVar2 = mraa::Gpio::write(&local_20,0,__buf_00,__n);
        if ((Result)sVar2 != SUCCESS) {
          mraa::printError((Result)sVar2);
          gpio_1.m_gpio._4_4_ = 1;
          goto LAB_0010250e;
        }
        sleep(1);
        sVar2 = mraa::Gpio::write(&gpio_2,0,__buf_01,__n);
        if ((Result)sVar2 != SUCCESS) {
          mraa::printError((Result)sVar2);
          gpio_1.m_gpio._4_4_ = 1;
          goto LAB_0010250e;
        }
        sVar2 = mraa::Gpio::write(&local_20,1,__buf_02,__n);
        if ((Result)sVar2 != SUCCESS) {
          mraa::printError((Result)sVar2);
          gpio_1.m_gpio._4_4_ = 1;
          goto LAB_0010250e;
        }
        sleep(1);
        __buf = extraout_RDX_00;
      }
      gpio_1.m_gpio._4_4_ = 0;
    }
    else {
      mraa::printError(RVar1);
      gpio_1.m_gpio._4_4_ = 1;
    }
  }
  else {
    mraa::printError(RVar1);
    gpio_1.m_gpio._4_4_ = 1;
  }
LAB_0010250e:
  mraa::Gpio::~Gpio(&local_20);
  mraa::Gpio::~Gpio(&gpio_2);
  return gpio_1.m_gpio._4_4_;
}

Assistant:

int
main(void)
{
    mraa::Result status;

    /* install signal handler */
    signal(SIGINT, sig_handler);

    //! [Interesting]
    /* initialize GPIO pin */
    mraa::Gpio gpio_1(GPIO_PIN_1);

    /* initialize GPIO pin */
    mraa::Gpio gpio_2(GPIO_PIN_2);

    /* set GPIO to output */
    status = gpio_1.dir(mraa::DIR_OUT);
    if (status != mraa::SUCCESS) {
        printError(status);
        return EXIT_FAILURE;
    }

    /* set gpio 24 to output */
    status = gpio_2.dir(mraa::DIR_OUT);
    if (status != mraa::SUCCESS) {
        printError(status);
        return EXIT_FAILURE;
    }

    /* toggle both GPIO's */
    while (flag) {
        status = gpio_1.write(1);
        if (status != mraa::SUCCESS) {
            printError(status);
            return EXIT_FAILURE;
        }
        status = gpio_2.write(0);
        if (status != mraa::SUCCESS) {
            printError(status);
            return EXIT_FAILURE;
        }

        sleep(1);

        status = gpio_1.write(0);
        if (status != mraa::SUCCESS) {
            printError(status);
            return EXIT_FAILURE;
        }

        status = gpio_2.write(1);
        if (status != mraa::SUCCESS) {
            printError(status);
            return EXIT_FAILURE;
        }

        sleep(1);
    }
    //! [Interesting]

    return EXIT_SUCCESS;
}